

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.cpp
# Opt level: O3

Value __thiscall xmrig::OclThread::toJSON(OclThread *this,Document *doc)

{
  uint uVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  void *pvVar2;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar4;
  int iVar5;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar6;
  Value VVar7;
  Value threads;
  Value si;
  Data local_68;
  Data local_58;
  Data local_48;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
  this->m_datasetHost = false;
  this->m_gcnAsm = false;
  *(undefined6 *)&this->field_0x2 = 0;
  (this->m_fields).super__Base_bitset<1UL>._M_w = 0;
  *(undefined2 *)((long)&(this->m_fields).super__Base_bitset<1UL>._M_w + 6) = 3;
  uVar1 = *(uint *)((long)&(doc->stack_).ownAllocator_ + 4);
  local_68._4_1_ = '\0';
  local_68._5_1_ = '\0';
  local_68._6_1_ = '\0';
  local_68._7_1_ = '\0';
  local_68._0_4_ = uVar1;
  local_48.s.str = (Ch *)0x40500000018c158;
  local_48.n = (Number)0x5;
  local_68.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,allocator);
  uVar1 = *(uint *)&(doc->stack_).stack_;
  local_68._4_1_ = '\0';
  local_68._5_1_ = '\0';
  local_68._6_1_ = '\0';
  local_68._7_1_ = '\0';
  local_68._0_4_ = uVar1;
  local_48.s.str = (Ch *)0x40500000018ba6f;
  local_48.n = (Number)0x9;
  local_68.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,allocator);
  uVar1 = *(uint *)&(doc->stack_).stackEnd_;
  local_68._4_1_ = '\0';
  local_68._5_1_ = '\0';
  local_68._6_1_ = '\0';
  local_68._7_1_ = '\0';
  local_68._0_4_ = uVar1;
  local_48.s.str = (Ch *)0x40500000018c140;
  local_48.n = (Number)0x8;
  local_68.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,allocator);
  if (((doc->
       super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
       ).data_.ss.str[8] & 1U) != 0) {
    local_48.n = (Number)0x0;
    local_48.s.str = (Ch *)0x4000000000000;
    pvVar2 = rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                       (allocator,(void *)0x0,0,0x20);
    local_48.s.str = (Ch *)((ulong)pvVar2 | 0x4000000000000);
    local_48.s.hashcode = 2;
    uVar1 = *(uint *)&(doc->stack_).stackTop_;
    local_68._4_1_ = '\0';
    local_68._5_1_ = '\0';
    local_68._6_1_ = '\0';
    local_68._7_1_ = '\0';
    local_68._0_4_ = uVar1;
    local_68.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_48.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_68.s,allocator);
    uVar1 = *(uint *)((long)&(doc->stack_).stack_ + 4);
    local_68._4_1_ = '\0';
    local_68._5_1_ = '\0';
    local_68._6_1_ = '\0';
    local_68._7_1_ = '\0';
    local_68._0_4_ = uVar1;
    local_68.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_48.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_68.s,allocator);
    local_68.s.str = (Ch *)0x40500000018c150;
    local_68.n.i64 = (Number)0xd;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_68.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_48.s,allocator);
  }
  local_58.n = (Number)0x0;
  local_58.s.str = (Ch *)0x4000000000000;
  pMVar6 = doc->allocator_;
  pMVar4 = doc->ownAllocator_;
  iVar5 = (int)((ulong)((long)pMVar4 - (long)pMVar6) >> 3);
  if (iVar5 != 0) {
    pvVar2 = rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                       (allocator,(void *)0x0,0,((long)pMVar4 - (long)pMVar6) * 2 & 0xffffffff0);
    local_58.s.str = (Ch *)((ulong)pvVar2 | 0x4000000000000);
    local_58.s.hashcode = iVar5;
    pMVar6 = doc->allocator_;
    pMVar4 = doc->ownAllocator_;
  }
  if (pMVar6 != pMVar4) {
    do {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_58.s,(long)pMVar6->chunkHead_,allocator);
      pMVar6 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)&pMVar6->chunk_capacity_;
    } while (pMVar6 != pMVar4);
  }
  local_68.s.str = (Ch *)0x40500000018829c;
  local_68.n = (Number)0x7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_58.s,allocator);
  uVar3 = extraout_RDX;
  if (((doc->
       super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
       ).data_.ss.str[8] & 2U) == 0) {
    uVar1 = *(uint *)((long)&(doc->stack_).stackTop_ + 4);
    local_68._4_1_ = '\0';
    local_68._5_1_ = '\0';
    local_68._6_1_ = '\0';
    local_68._7_1_ = '\0';
    local_68._0_4_ = uVar1;
    local_48.s.str = (Ch *)0x40500000018c149;
    local_48.n = (Number)0x6;
    local_68.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_48.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68.s,allocator);
    uVar3 = extraout_RDX_00;
  }
  VVar7.data_.s.str = (Ch *)uVar3;
  VVar7.data_.n = (Number)this;
  return (Value)VVar7.data_;
}

Assistant:

rapidjson::Value xmrig::OclThread::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kObjectType);

    out.AddMember(StringRef(kIndex),        index(), allocator);
    out.AddMember(StringRef(kIntensity),    intensity(), allocator);
    out.AddMember(StringRef(kWorksize),     worksize(), allocator);

    if (m_fields.test(STRIDED_INDEX_FIELD)) {
        Value si(kArrayType);
        si.Reserve(2, allocator);
        si.PushBack(stridedIndex(), allocator);
        si.PushBack(memChunk(), allocator);
        out.AddMember(StringRef(kStridedIndex), si, allocator);
    }

    Value threads(kArrayType);
    threads.Reserve(m_threads.size(), allocator);

    for (auto thread : m_threads) {
        threads.PushBack(thread, allocator);
    }

    out.AddMember(StringRef(kThreads), threads, allocator);

    if (m_fields.test(RANDOMX_FIELDS)) {
    }
    else {
        out.AddMember(StringRef(kUnroll), unrollFactor(), allocator);
    }

    return out;
}